

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O1

void __thiscall
libcellml::HistoryEpoch::HistoryEpoch
          (HistoryEpoch *this,ComponentConstPtr *component,string *sourceUrl,string *destinationUrl)

{
  pointer pcVar1;
  element_type *peVar2;
  ImportedEntityConstPtr local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  (this->mDestinationModel).super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mDestinationModel).super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = &(this->mDestinationUrl).field_2;
  (this->mDestinationUrl)._M_dataplus._M_p = (pointer)local_40;
  pcVar1 = (destinationUrl->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mDestinationUrl,pcVar1,pcVar1 + destinationUrl->_M_string_length);
  local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_38 = &this->mDestinationUrl;
  owningModel((ParentedEntityConstPtr *)&this->mSourceModel);
  if (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  NamedEntity::name_abi_cxx11_
            (&this->mName,
             (NamedEntity *)
             (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr);
  local_48 = &(this->mReferenceName).field_2;
  (this->mReferenceName)._M_dataplus._M_p = (pointer)local_48;
  (this->mReferenceName)._M_string_length = 0;
  (this->mReferenceName).field_2._M_local_buf[0] = '\0';
  (this->mSourceUrl)._M_dataplus._M_p = (pointer)&(this->mSourceUrl).field_2;
  pcVar1 = (sourceUrl->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mSourceUrl,pcVar1,pcVar1 + sourceUrl->_M_string_length);
  (this->mType)._M_dataplus._M_p = (pointer)&(this->mType).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->mType,"component","");
  peVar2 = (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &peVar2->super_ImportedEntity;
  if (peVar2 == (element_type *)0x0) {
    local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
  }
  local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  setReferenceName(this,&local_58);
  if (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar2 = (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &peVar2->super_ImportedEntity;
  if (peVar2 == (element_type *)0x0) {
    local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
  }
  local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  setDestinationModel(this,&local_58);
  if (local_58.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

HistoryEpoch::HistoryEpoch(const ComponentConstPtr &component, const std::string &sourceUrl, const std::string &destinationUrl)
    : mDestinationModel(nullptr)
    , mDestinationUrl(destinationUrl)
    , mSourceModel(owningModel(component))
    , mName(component->name())
    , mSourceUrl(sourceUrl)
    , mType("component")
{
    setReferenceName(component);
    setDestinationModel(component);
}